

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O0

void adios2::PrintMVI(ostream *os,MinVarInfo *mvi)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  ostream *poVar4;
  const_iterator os_00;
  reference blk_00;
  ulong *in_RSI;
  ostream *in_RDI;
  MinBlockInfo *blk;
  const_iterator __end1;
  const_iterator __begin1;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *__range1;
  int i;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
  local_28;
  ulong *local_20;
  int local_14;
  ulong *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar2 = std::operator<<(in_RDI,"Step: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_10);
  poVar2 = std::operator<<(poVar2,"  Dims: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)local_10 + 0xc));
  std::operator<<(poVar2," Shape: {");
  if ((*(int *)((long)local_10 + 0xc) == 0) || (local_10[2] == 0)) {
    std::operator<<(local_8,"NULL");
  }
  else {
    for (local_14 = 0; local_14 < *(int *)((long)local_10 + 0xc); local_14 = local_14 + 1) {
      std::ostream::operator<<(local_8,*(ulong *)(local_10[2] + (long)local_14 * 8));
      if (local_14 < *(int *)((long)local_10 + 0xc) + -1) {
        std::operator<<(local_8,", ");
      }
    }
  }
  poVar2 = std::operator<<(local_8,"}, BlockCount: ");
  sVar3 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                    ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                     (local_10 + 4));
  poVar4 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar4," ");
  local_20 = local_10 + 4;
  local_28._M_current =
       (MinBlockInfo *)
       std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::begin
                 (in_stack_ffffffffffffffb8);
  os_00 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::end
                    (in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
                             *)poVar2,
                            (__normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    blk_00 = __gnu_cxx::
             __normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
             ::operator*(&local_28);
    PrintMBI((ostream *)os_00._M_current,blk_00,(int)((ulong)poVar2 >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_adios2::MinBlockInfo_*,_std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>_>
    ::operator++(&local_28);
  }
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintMVI(std::ostream &os, const MinVarInfo &mvi)
{
    os << "Step: " << mvi.Step << "  Dims: " << mvi.Dims << " Shape: {";
    if ((mvi.Dims == 0) || (mvi.Shape == NULL))
        os << "NULL";
    else
    {
        for (int i = 0; i < mvi.Dims; i++)
        {
            os << mvi.Shape[i];
            if (i < mvi.Dims - 1)
                os << ", ";
        }
    }
    os << "}, BlockCount: " << mvi.BlocksInfo.size() << " ";
    for (const auto &blk : mvi.BlocksInfo)
        PrintMBI(os, blk, mvi.Dims);
    os << std::endl;
}